

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOrderDirectories.cxx
# Opt level: O2

void __thiscall cmOrderDirectories::DiagnoseCycle(cmOrderDirectories *this)

{
  cmOrderDirectoriesConstraint *pcVar1;
  cmake *this_00;
  ostream *poVar2;
  string *psVar3;
  uint uVar4;
  ulong uVar5;
  pointer pCVar6;
  pointer ppVar7;
  cmListFileBacktrace local_1e8;
  string local_1c8;
  ostringstream e;
  
  if (this->CycleDiagnosed == false) {
    this->CycleDiagnosed = true;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    poVar2 = std::operator<<((ostream *)&e,"Cannot generate a safe ");
    poVar2 = std::operator<<(poVar2,(string *)&this->Purpose);
    poVar2 = std::operator<<(poVar2," for target ");
    psVar3 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
    poVar2 = std::operator<<(poVar2,(string *)psVar3);
    std::operator<<(poVar2," because there is a cycle in the constraint graph:\n");
    uVar4 = 0;
    while( true ) {
      uVar5 = (ulong)uVar4;
      pCVar6 = (this->ConflictGraph).
               super__Vector_base<cmOrderDirectories::ConflictList,_std::allocator<cmOrderDirectories::ConflictList>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)(((long)(this->ConflictGraph).
                         super__Vector_base<cmOrderDirectories::ConflictList,_std::allocator<cmOrderDirectories::ConflictList>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar6) / 0x18) <= uVar5
         ) break;
      poVar2 = std::operator<<((ostream *)&e,"  dir ");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      poVar2 = std::operator<<(poVar2," is [");
      poVar2 = std::operator<<(poVar2,(string *)
                                      ((this->OriginalDirectories).
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + uVar5));
      std::operator<<(poVar2,"]\n");
      pCVar6 = pCVar6 + uVar5;
      for (ppVar7 = *(pointer *)
                     &(pCVar6->
                      super_vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl;
          ppVar7 != (pCVar6->
                    super_vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish; ppVar7 = ppVar7 + 1) {
        poVar2 = std::operator<<((ostream *)&e,"    dir ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,ppVar7->first);
        std::operator<<(poVar2," must precede it due to ");
        pcVar1 = (this->ConstraintEntries).
                 super__Vector_base<cmOrderDirectoriesConstraint_*,_std::allocator<cmOrderDirectoriesConstraint_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[ppVar7->second];
        (*pcVar1->_vptr_cmOrderDirectoriesConstraint[2])(pcVar1,&e);
        std::operator<<((ostream *)&e,"\n");
      }
      uVar4 = uVar4 + 1;
    }
    std::operator<<((ostream *)&e,"Some of these libraries may not be found correctly.");
    this_00 = this->GlobalGenerator->CMakeInstance;
    std::__cxx11::stringbuf::str();
    cmGeneratorTarget::GetBacktrace(&local_1e8,this->Target);
    cmake::IssueMessage(this_00,WARNING,&local_1c8,&local_1e8);
    cmListFileBacktrace::~cmListFileBacktrace(&local_1e8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
  }
  return;
}

Assistant:

void cmOrderDirectories::DiagnoseCycle()
{
  // Report the cycle at most once.
  if (this->CycleDiagnosed) {
    return;
  }
  this->CycleDiagnosed = true;

  // Construct the message.
  std::ostringstream e;
  e << "Cannot generate a safe " << this->Purpose << " for target "
    << this->Target->GetName()
    << " because there is a cycle in the constraint graph:\n";

  // Display the conflict graph.
  for (unsigned int i = 0; i < this->ConflictGraph.size(); ++i) {
    ConflictList const& clist = this->ConflictGraph[i];
    e << "  dir " << i << " is [" << this->OriginalDirectories[i] << "]\n";
    for (ConflictList::const_iterator j = clist.begin(); j != clist.end();
         ++j) {
      e << "    dir " << j->first << " must precede it due to ";
      this->ConstraintEntries[j->second]->Report(e);
      e << "\n";
    }
  }
  e << "Some of these libraries may not be found correctly.";
  this->GlobalGenerator->GetCMakeInstance()->IssueMessage(
    cmake::WARNING, e.str(), this->Target->GetBacktrace());
}